

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

Task * __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this)

{
  bool bVar1;
  __pointer_type p;
  Task *pTVar2;
  atomic<depspawn::internal::TaskPool::Task_*> *in_RDI;
  atomic<depspawn::internal::TaskPool::Task_*> *unaff_retaddr;
  Task *ret;
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *in_stack_00000030;
  atomic<depspawn::internal::TaskPool::Task_*> *in_stack_ffffffffffffffe0;
  atomic<depspawn::internal::TaskPool::Task_*> *__p1;
  
  __p1 = in_RDI;
  p = std::atomic<depspawn::internal::TaskPool::Task_*>::load
                (in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  do {
    while (pTVar2 = clean_ptr(p), pTVar2 == (Task *)0x0) {
      allocate(in_stack_00000030);
      p = std::atomic<depspawn::internal::TaskPool::Task_*>::load
                    (in_RDI,(memory_order)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    }
    in_stack_ffffffffffffffe0 = in_RDI + 4;
    pTVar2 = clean_ptr(p);
    pTVar2 = clean_ptr(pTVar2->next);
    next_ptr(pTVar2,p);
    bVar1 = std::atomic<depspawn::internal::TaskPool::Task_*>::compare_exchange_weak
                      (unaff_retaddr,(__pointer_type *)__p1,p,(memory_order)((ulong)in_RDI >> 0x20))
    ;
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  pTVar2 = clean_ptr(p);
  return pTVar2;
}

Assistant:

T* intl_malloc()
  {
    T* ret = head_.load(std::memory_order_relaxed);
    do {
      while(clean_ptr(ret) == nullptr) {
        allocate();
        ret = head_.load(std::memory_order_relaxed);
      }
    } while(!head_.compare_exchange_weak(ret, next_ptr(clean_ptr(static_cast<T *>(clean_ptr(ret)->next)), ret)));
    
    //Notice that we do not make a new (ret) T()
    return clean_ptr(ret);
  }